

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclPrintFaninPairs(SC_Man *p,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  long lVar1;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < pNtk->vObjs->nSize; i_00 = i_00 + 1) {
    pObj = Abc_NtkObj(pNtk,i_00);
    if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
      for (lVar1 = 0; lVar1 < (pObj->vFanins).nSize; lVar1 = lVar1 + 1) {
        pFanin = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar1]];
        if (((*(uint *)&pFanin->field_0x14 & 0xf) == 7) && ((pFanin->vFanouts).nSize == 1)) {
          Abc_SclCheckCommonInputs(pObj,pFanin);
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_SclPrintFaninPairs( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
                Abc_SclCheckCommonInputs( pObj, pFanin );
}